

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O0

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanup
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  bool bVar1;
  AllocationPolicy *pAVar2;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  AllocationPolicy *local_30;
  AllocationPolicy *policy_local;
  size_t n_local;
  SerialArena *this_local;
  
  local_30 = policy;
  policy_local = (AllocationPolicy *)n;
  n_local = (size_t)this;
  pAVar2 = (AllocationPolicy *)AlignUpTo8(n);
  local_69 = 0;
  if (pAVar2 != policy_local) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xf4);
    local_69 = 1;
    other = LogMessage::operator<<(&local_68,"CHECK failed: (internal::AlignUpTo8(n)) == (n): ");
    LogFinisher::operator=(local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  bVar1 = HasSpace(this,(size_t)&policy_local->block_alloc);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    _this_local = AllocateFromExistingWithCleanupFallback(this,(size_t)policy_local);
  }
  else {
    _this_local = AllocateAlignedWithCleanupFallback(this,(size_t)policy_local,local_30);
  }
  return _this_local;
}

Assistant:

std::pair<void*, CleanupNode*> AllocateAlignedWithCleanup(
      size_t n, const AllocationPolicy* policy) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n + kCleanupSize))) {
      return AllocateAlignedWithCleanupFallback(n, policy);
    }
    return AllocateFromExistingWithCleanupFallback(n);
  }